

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O1

void check_keen_vision(CHAR_DATA *ch,CHAR_DATA *victim)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char buf [4608];
  char acStack_1238 [4616];
  
  for (ch_00 = ch->in_room->people; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next_in_room) {
    if ((((ch_00 != victim && ch_00 != ch) && (bVar1 = can_see(ch_00,ch), bVar1)) &&
        (iVar2 = get_skill(ch_00,(int)gsn_keen_vision), iVar2 != 0)) &&
       (iVar3 = number_percent(), iVar3 < iVar2)) {
      pcVar4 = pers(ch,ch_00);
      pcVar5 = pers(victim,ch_00);
      sprintf(acStack_1238,"You notice %s slipping into %s\'s inventory.\n\r",pcVar4,pcVar5);
      send_to_char(acStack_1238,ch_00);
      check_improve(ch_00,(int)gsn_keen_vision,true,1);
    }
  }
  return;
}

Assistant:

void check_keen_vision(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *gch;
	int chance;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (gch == ch || gch == victim)
			continue;

		if (!can_see(gch, ch))
			continue;

		chance = get_skill(gch, gsn_keen_vision);
		if (chance == 0)
			continue;

		if (number_percent() < chance)
		{
			sprintf(buf, "You notice %s slipping into %s's inventory.\n\r", pers(ch, gch), pers(victim, gch));
			send_to_char(buf, gch);
			check_improve(gch, gsn_keen_vision, true, 1);
		}
	}
}